

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::is_value_empty
          (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this)

{
  bool bVar1;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this_local;
  
  bVar1 = has_connections(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->_empty & 1U) == 0) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->_attrib);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool is_value_empty() const {
    if (has_connections()) {
      return false;
    }

    if (_empty) {
      return true;
    }

    if (_attrib) {
      return false;
    }

    return true;
  }